

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

void cf_socket_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  void *pvVar1;
  cf_socket_ctx *ctx;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if (*(int *)((long)pvVar1 + 0x98) != -1) {
    if ((*(byte *)((long)pvVar1 + 0x134) >> 1 & 1) == 0) {
      if ((cf->field_0x24 & 1) == 0) {
        Curl_pollset_change(data,ps,*(curl_socket_t *)((long)pvVar1 + 0x98),2,1);
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"adjust_pollset, !connected, POLLOUT fd=%d",
                            (ulong)*(uint *)((long)pvVar1 + 0x98));
        }
      }
      else if ((((((*(byte *)((long)pvVar1 + 0x134) >> 4 & 1) == 0) &&
                 (Curl_pollset_change(data,ps,*(curl_socket_t *)((long)pvVar1 + 0x98),1,0),
                 data != (Curl_easy *)0x0)) &&
                ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"adjust_pollset, !active, POLLIN fd=%d",
                          (ulong)*(uint *)((long)pvVar1 + 0x98));
      }
    }
    else {
      Curl_pollset_change(data,ps,*(curl_socket_t *)((long)pvVar1 + 0x98),1,2);
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"adjust_pollset, listening, POLLIN fd=%d",
                          (ulong)*(uint *)((long)pvVar1 + 0x98));
      }
    }
  }
  return;
}

Assistant:

static void cf_socket_adjust_pollset(struct Curl_cfilter *cf,
                                      struct Curl_easy *data,
                                      struct easy_pollset *ps)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  if(ctx->sock != CURL_SOCKET_BAD) {
    /* A listening socket filter needs to be connected before the accept
     * for some weird FTP interaction. This should be rewritten, so that
     * FTP no longer does the socket checks and accept calls and delegates
     * all that to the filter. TODO. */
    if(ctx->listening) {
      Curl_pollset_set_in_only(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset, listening, POLLIN fd=%"
                  FMT_SOCKET_T, ctx->sock);
    }
    else if(!cf->connected) {
      Curl_pollset_set_out_only(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset, !connected, POLLOUT fd=%"
                  FMT_SOCKET_T, ctx->sock);
    }
    else if(!ctx->active) {
      Curl_pollset_add_in(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset, !active, POLLIN fd=%"
                  FMT_SOCKET_T, ctx->sock);
    }
  }
}